

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O2

longdouble * __thiscall
fire::optional<long_double>::value(longdouble *__return_storage_ptr__,optional<long_double> *this)

{
  bool pass;
  longdouble *plVar1;
  allocator<char> local_39;
  string local_38;
  
  pass = *(bool *)(__return_storage_ptr__ + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"accessing unassigned optional",&local_39);
  _instant_assert(pass,&local_38,true);
  plVar1 = (longdouble *)std::__cxx11::string::~string((string *)&local_38);
  return plVar1;
}

Assistant:

T value() const { _instant_assert(_exists, "accessing unassigned optional"); return _value; }